

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall ON_TextureMapping::ReverseTextureCoordinate(ON_TextureMapping *this,int dir)

{
  long lVar1;
  double *pdVar2;
  ON_Xform *pOVar3;
  ON_Xform *pOVar4;
  byte bVar5;
  ON_Xform x;
  ON_Xform OStack_118;
  ON_Xform local_98;
  
  bVar5 = 0;
  if ((uint)dir < 4) {
    pdVar2 = (double *)&ON_Xform::IdentityTransformation;
    pOVar3 = &OStack_118;
    for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(double *)pOVar3 = *pdVar2;
      pdVar2 = pdVar2 + 1;
      pOVar3 = (ON_Xform *)((long)pOVar3 + 8);
    }
    *(undefined8 *)((long)OStack_118.m_xform + (ulong)(uint)dir * 0x28) = 0xbff0000000000000;
    OStack_118.m_xform[(uint)dir][3] = 1.0;
    ON_Xform::operator*(&local_98,&OStack_118,&this->m_uvw);
    pOVar3 = &local_98;
    pOVar4 = &this->m_uvw;
    for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
      pOVar4->m_xform[0][0] = pOVar3->m_xform[0][0];
      pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      pOVar4 = (ON_Xform *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
    }
  }
  return (uint)dir < 4;
}

Assistant:

bool ON_TextureMapping::ReverseTextureCoordinate( int dir )
{
  bool rc = false;
  if ( 0 <= dir && dir <= 3 )
  {
    ON_Xform x(ON_Xform::IdentityTransformation);
    x.m_xform[dir][dir] = -1.0;
    x.m_xform[dir][3] = 1.0;
    m_uvw = x*m_uvw;
    rc = true;
  }
  return rc;
}